

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_stdlib.hpp
# Opt level: O0

ModulePtr chaiscript::Std_Lib::library(void)

{
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar1;
  ModulePtr *in_stack_00000010;
  string *in_stack_00000018;
  ModulePtr *in_stack_00000040;
  string *in_stack_00000048;
  ModulePtr *lib;
  ModulePtr *in_stack_00000350;
  string *in_stack_00000358;
  ModulePtr *in_stack_00002888;
  string *in_stack_fffffffffffffd58;
  Module *in_stack_fffffffffffffd60;
  Proxy_Function *in_stack_fffffffffffffd68;
  Module *this_00;
  string local_218 [48];
  ModulePtr *in_stack_fffffffffffffe18;
  undefined1 local_1d1 [80];
  allocator local_181;
  string local_180 [71];
  allocator local_139;
  string local_138 [24];
  ModulePtr *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  allocator local_f1;
  string local_f0 [71];
  allocator local_a9;
  string local_a8 [71];
  allocator local_61;
  string local_60 [87];
  undefined1 local_9;
  
  local_9 = 0;
  std::make_shared<chaiscript::Module>();
  bootstrap::Bootstrap::bootstrap(in_stack_00002888);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34dcd0);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34dcdd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Vector",&local_61);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::
  vector_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (in_stack_00000018,in_stack_00000010);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34dd5e);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34dd6b);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34dd92);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"string",&local_a9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::string_type<std::__cxx11::string>
            (in_stack_00000358,in_stack_00000350);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34de13);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34de20);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34de47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Map",&local_f1);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::
  map_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (in_stack_00000048,in_stack_00000040);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34dec8);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34ded5);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34defc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"Pair",&local_139);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34df7d);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34df8a);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34dfb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"future",&local_181);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34e032);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34e03f);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34e066);
  fun<chaiscript::Std_Lib::library()::_lambda(std::function<chaiscript::Boxed_Value()>const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)in_stack_fffffffffffffd58);
  this_00 = (Module *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1d1 + 1),"async",(allocator *)this_00);
  Module::add(this_00,in_stack_fffffffffffffd68,(string *)in_stack_fffffffffffffd60);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x34e0f2);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34e0ff);
  std::make_shared<chaiscript::Module>();
  json_wrap::library(in_stack_fffffffffffffe18);
  Module::add(in_stack_fffffffffffffd60,(shared_ptr<chaiscript::Module> *)in_stack_fffffffffffffd58)
  ;
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34e14b);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x34e158);
  this = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x34e165);
  ChaiScript_Prelude::chaiscript_prelude_abi_cxx11_();
  Module::eval(this,in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_218);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ModulePtr library()
      {
        using namespace bootstrap;

        ModulePtr lib = Bootstrap::bootstrap();

        lib->add(standard_library::vector_type<std::vector<Boxed_Value> >("Vector"));
        lib->add(standard_library::string_type<std::string>("string"));
        lib->add(standard_library::map_type<std::map<std::string, Boxed_Value> >("Map"));
        lib->add(standard_library::pair_type<std::pair<Boxed_Value, Boxed_Value > >("Pair"));

#ifndef CHAISCRIPT_NO_THREADS
        lib->add(standard_library::future_type<std::future<chaiscript::Boxed_Value>>("future"));
        lib->add(chaiscript::fun([](const std::function<chaiscript::Boxed_Value ()> &t_func){ return std::async(std::launch::async, t_func);}), "async");
#endif

        lib->add(json_wrap::library());

        lib->eval(ChaiScript_Prelude::chaiscript_prelude() /*, "standard prelude"*/ );

        return lib;
      }